

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void non_empty_readdir_cb(uv_fs_t *req)

{
  void *dir_00;
  int iVar1;
  uv_loop_t *puVar2;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  dir_00 = readdir_req.ptr;
  if (req != &readdir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x11d,"req == &readdir_req");
    abort();
  }
  if (readdir_req.fs_type != UV_FS_READDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x11e,"req->fs_type == UV_FS_READDIR");
    abort();
  }
  if (readdir_req.result == 0) {
    uv_fs_req_cleanup(&readdir_req);
    if (non_empty_readdir_cb_count != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
              ,0x123,"non_empty_readdir_cb_count == 3");
      abort();
    }
    puVar2 = uv_default_loop();
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)dir_00,non_empty_closedir_cb);
  }
  else {
    if (readdir_req.result != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
              ,0x129,"req->result == 1");
      abort();
    }
    if (*readdir_req.ptr != dirents) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
              ,0x12a,"dir->dirents == dirents");
      abort();
    }
    iVar1 = strcmp(dirents[0].name,"file1");
    if (((iVar1 != 0) && (iVar1 = strcmp(dirents[0].name,"file2"), iVar1 != 0)) &&
       (iVar1 = strcmp(dirents[0].name,"test_subdir"), iVar1 != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
              ,0x12d,
              "strcmp(dirents[0].name, \"file1\") == 0 || strcmp(dirents[0].name, \"file2\") == 0 || strcmp(dirents[0].name, \"test_subdir\") == 0"
             );
      abort();
    }
    iVar1 = strcmp(dirents[0].name,"test_subdir");
    if (iVar1 == 0) {
      if (dirents[0].type != UV_DIRENT_DIR) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
                ,0x130,"dirents[0].type == UV_DIRENT_DIR");
        abort();
      }
    }
    else if (dirents[0].type != UV_DIRENT_FILE) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
              ,0x132,"dirents[0].type == UV_DIRENT_FILE");
      abort();
    }
    non_empty_readdir_cb_count = non_empty_readdir_cb_count + 1;
    uv_fs_req_cleanup(&readdir_req);
    *(uv_dirent_t **)dir_00 = dirents;
    *(undefined8 *)((long)dir_00 + 8) = 1;
    puVar2 = uv_default_loop();
    uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)dir_00,non_empty_readdir_cb);
  }
  return;
}

Assistant:

static void non_empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  dir = req->ptr;

  if (req->result == 0) {
    uv_fs_req_cleanup(req);
    ASSERT(non_empty_readdir_cb_count == 3);
    uv_fs_closedir(uv_default_loop(),
                   &closedir_req,
                   dir,
                   non_empty_closedir_cb);
  } else {
    ASSERT(req->result == 1);
    ASSERT(dir->dirents == dirents);
    ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
           strcmp(dirents[0].name, "file2") == 0 ||
           strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */

    ++non_empty_readdir_cb_count;
    uv_fs_req_cleanup(req);
    dir->dirents = dirents;
    dir->nentries = ARRAY_SIZE(dirents);
    uv_fs_readdir(uv_default_loop(),
                  &readdir_req,
                  dir,
                  non_empty_readdir_cb);
  }
}